

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

pos_type __thiscall
lrit::anon_unknown_0::offsetfilebuf::seekoff
          (offsetfilebuf *this,off_type off,seekdir dir,openmode which)

{
  int in_EDX;
  _Ios_Seekdir in_ESI;
  fpos<__mbstate_t> *in_RDI;
  fpos<__mbstate_t> fVar1;
  pos_type pVar2;
  pos_type pos;
  fpos<__mbstate_t> *in_stack_ffffffffffffff88;
  
  std::fpos<__mbstate_t>::fpos(in_RDI,(streamoff)in_stack_ffffffffffffff88);
  if (in_EDX == 1) {
    std::filebuf::seekoff((long)in_RDI,in_ESI,_S_app);
  }
  else if (in_EDX == 2) {
    std::filebuf::seekoff((long)in_RDI,in_ESI,_S_ate);
  }
  else if (in_EDX == 0) {
    std::filebuf::seekoff
              ((long)in_RDI,in_ESI + (int)in_RDI[0xf]._M_off,
               ~(_S_ios_openmode_min|_S_ios_openmode_max));
  }
  fVar1 = std::fpos<__mbstate_t>::operator-(in_stack_ffffffffffffff88,0x2c0faa);
  pVar2._M_off = fVar1._M_off;
  pVar2._M_state = fVar1._M_state;
  return pVar2;
}

Assistant:

pos_type seekoff(
      off_type off,
      std::ios_base::seekdir dir,
      std::ios_base::openmode which = std::ios_base::in) override {
    pos_type pos = 0;
    if (dir == std::ios_base::cur) {
      pos = std::filebuf::seekoff(off, dir, which);
    } else if (dir == std::ios_base::end) {
      pos = std::filebuf::seekoff(off, dir, which);
    } else if (dir == std::ios_base::beg) {
      pos = std::filebuf::seekoff(off + offset_, dir, which);
    }
    return pos - offset_;
  }